

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O3

char * fmt::v6::internal::sprintf_format<double>(double value,buffer<char> *buf,sprintf_specs specs)

{
  uint uVar1;
  byte *pbVar2;
  byte bVar3;
  byte bVar4;
  byte *pbVar5;
  byte bVar6;
  byte *pbVar7;
  byte *__src;
  ulong uVar8;
  byte *pbVar9;
  ulong uVar10;
  byte *pbVar11;
  char format [10];
  char local_42 [10];
  double local_38;
  
  local_42[0] = '%';
  bVar6 = specs.type;
  if (((ulong)specs >> 0x28 & 1) == 0 && bVar6 != 0) {
    pbVar2 = (byte *)(local_42 + 1);
  }
  else {
    pbVar2 = (byte *)(local_42 + 2);
    local_42[1] = 0x23;
  }
  if (-1 < specs.precision) {
    pbVar2[0] = 0x2e;
    pbVar2[1] = 0x2a;
    pbVar2 = pbVar2 + 2;
  }
  bVar3 = bVar6;
  if (bVar6 == 0x6e) {
    bVar3 = 0x67;
  }
  if (bVar6 == 0) {
    bVar3 = 0x67;
  }
  bVar4 = 0x66;
  if (bVar6 != 0x25) {
    bVar4 = bVar3;
  }
  *pbVar2 = bVar4;
  pbVar2[1] = 0;
  local_38 = value;
LAB_0014e1a0:
  uVar1 = format_float<double>(buf->ptr_,buf->capacity_,local_42,specs.precision,local_38);
  if ((int)uVar1 < 0) goto LAB_0014e1d1;
  uVar8 = (ulong)uVar1;
  uVar10 = buf->capacity_;
  if (uVar10 <= uVar8) {
    uVar10 = (ulong)(uVar1 + 1);
    goto LAB_0014e1de;
  }
  pbVar2 = (byte *)buf->ptr_;
  if ((*pbVar2 == 0x2d) || (pbVar9 = pbVar2, *pbVar2 == 0x2b)) {
    pbVar9 = pbVar2 + 1;
  }
  pbVar11 = (byte *)0x0;
  if (((bVar6 & 0xdf) != 0x41) && (pbVar7 = pbVar2 + uVar8, pbVar9 < pbVar7)) {
    pbVar11 = (byte *)0x0;
    do {
      pbVar5 = pbVar9 + 1;
      if (9 < (byte)(*pbVar9 - 0x30)) {
        if ((*pbVar9 | 0x20) == 0x65) {
          pbVar11 = (byte *)0x0;
        }
        else {
          pbVar11 = pbVar9;
          if (bVar6 == 0) {
            pbVar9 = pbVar9 + 2;
            if (*pbVar5 != 0x30) {
              pbVar9 = pbVar5;
            }
            pbVar5 = pbVar7;
            if (pbVar9 == pbVar7) goto LAB_0014e28a;
            pbVar2 = pbVar2 + (uVar8 - (long)pbVar9);
            goto LAB_0014e26b;
          }
        }
        break;
      }
      pbVar9 = pbVar5;
    } while (pbVar5 < pbVar7);
  }
  goto LAB_0014e293;
LAB_0014e1d1:
  if (buf->capacity_ != 0xffffffffffffffff) {
    uVar10 = buf->capacity_ + 1;
LAB_0014e1de:
    (**buf->_vptr_buffer)(buf,uVar10);
  }
  goto LAB_0014e1a0;
  while( true ) {
    pbVar9 = pbVar9 + 1;
    pbVar2 = pbVar2 + -1;
    if (pbVar9 == pbVar7) break;
LAB_0014e26b:
    if (8 < (byte)(*pbVar9 - 0x31)) {
      __src = pbVar9;
      pbVar5 = pbVar9;
      if (pbVar9 != pbVar7) goto LAB_0014e2c1;
      break;
    }
  }
  goto LAB_0014e28a;
  while( true ) {
    __src = __src + 1;
    pbVar2 = pbVar2 + -1;
    if (__src == pbVar7) break;
LAB_0014e2c1:
    if (*__src != 0x30) {
      if (0xf5 < (byte)(*__src - 0x3a)) goto LAB_0014e293;
      memmove(pbVar9,__src,(size_t)pbVar2);
      uVar10 = buf->capacity_;
      pbVar7 = __src;
      break;
    }
  }
LAB_0014e28a:
  uVar8 = (ulong)(uVar1 + ((int)pbVar5 - (int)pbVar7));
LAB_0014e293:
  if (uVar10 < uVar8) {
    (**buf->_vptr_buffer)(buf,uVar8);
  }
  buf->size_ = uVar8;
  return (char *)pbVar11;
}

Assistant:

char* sprintf_format(Double value, internal::buffer<char>& buf,
                     sprintf_specs specs) {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buf.capacity() != 0, "empty buffer");

  // Build format string.
  enum { max_format_size = 10 };  // longest format: %#-*.*Lg
  char format[max_format_size];
  char* format_ptr = format;
  *format_ptr++ = '%';
  if (specs.alt || !specs.type) *format_ptr++ = '#';
  if (specs.precision >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }
  if (std::is_same<Double, long double>::value) *format_ptr++ = 'L';

  char type = specs.type;

  if (type == '%')
    type = 'f';
  else if (type == 0 || type == 'n')
    type = 'g';
#if FMT_MSC_VER
  if (type == 'F') {
    // MSVC's printf doesn't support 'F'.
    type = 'f';
  }
#endif
  *format_ptr++ = type;
  *format_ptr = '\0';

  // Format using snprintf.
  char* start = nullptr;
  char* decimal_point_pos = nullptr;
  for (;;) {
    std::size_t buffer_size = buf.capacity();
    start = &buf[0];
    int result =
        format_float(start, buffer_size, format, specs.precision, value);
    if (result >= 0) {
      unsigned n = internal::to_unsigned(result);
      if (n < buf.capacity()) {
        // Find the decimal point.
        auto p = buf.data(), end = p + n;
        if (*p == '+' || *p == '-') ++p;
        if (specs.type != 'a' && specs.type != 'A') {
          while (p < end && *p >= '0' && *p <= '9') ++p;
          if (p < end && *p != 'e' && *p != 'E') {
            decimal_point_pos = p;
            if (!specs.type) {
              // Keep only one trailing zero after the decimal point.
              ++p;
              if (*p == '0') ++p;
              while (p != end && *p >= '1' && *p <= '9') ++p;
              char* where = p;
              while (p != end && *p == '0') ++p;
              if (p == end || *p < '0' || *p > '9') {
                if (p != end) std::memmove(where, p, to_unsigned(end - p));
                n -= static_cast<unsigned>(p - where);
              }
            }
          }
        }
        buf.resize(n);
        break;  // The buffer is large enough - continue with formatting.
      }
      buf.reserve(n + 1);
    } else {
      // If result is negative we ask to increase the capacity by at least 1,
      // but as std::vector, the buffer grows exponentially.
      buf.reserve(buf.capacity() + 1);
    }
  }
  return decimal_point_pos;
}